

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation_node.cpp
# Opt level: O2

void __thiscall
duckdb::SetOperationNode::SetOperationNode
          (SetOperationNode *this,SetOperationType setop_type,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *left,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *right,
          vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
          *children,bool setop_all)

{
  __uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *p_Var1;
  pointer puVar2;
  ulong uVar3;
  reference pvVar4;
  reference args_2;
  SerializationException *pSVar5;
  pointer puVar6;
  ulong uVar7;
  SetOperationType setop_type_local;
  bool setop_all_local;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *local_98;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *local_90;
  QueryNode *local_88;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_80;
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
  new_children;
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
  empty_children;
  
  setop_type_local = setop_type;
  setop_all_local = setop_all;
  QueryNode::QueryNode(&this->super_QueryNode,SET_OPERATION_NODE);
  (this->super_QueryNode)._vptr_QueryNode = (_func_int **)&PTR__SetOperationNode_027a87f0;
  this->setop_type = setop_type;
  this->setop_all = setop_all;
  local_90 = &this->left;
  local_98 = &this->right;
  (this->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  (this->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  if (((left->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) &&
     ((right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0)) {
    ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
              ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               local_90,(__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                         *)left);
    ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
              ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               local_98,(__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                         *)right);
    return;
  }
  puVar6 = (children->
           super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (children->
           super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)puVar2 - (long)puVar6;
  if (uVar7 == 0x10) {
    p_Var1 = (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
             vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
             ::get<true>(children,0);
    ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
              ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               local_90,p_Var1);
    p_Var1 = (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
             vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
             ::get<true>(children,1);
    ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
              ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               local_98,p_Var1);
    puVar6 = (children->
             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (children->
             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)puVar2 - (long)puVar6;
  }
  if (8 < uVar7) {
    if (setop_type_local == UNION) {
      while (0x10 < (ulong)((long)puVar2 - (long)puVar6)) {
        new_children.
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        new_children.
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        new_children.
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar7 = 0; uVar3 = (long)puVar2 - (long)puVar6 >> 3, uVar7 < uVar3; uVar7 = uVar7 + 2)
        {
          if (uVar7 + 1 == uVar3) {
            pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                     ::get<true>(children,uVar7);
            ::std::
            vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
                        *)&new_children,pvVar4);
          }
          else {
            empty_children.
            super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            empty_children.
            super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            empty_children.
            super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                     ::get<true>(children,uVar7);
            args_2 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                     ::get<true>(children,uVar7 + 1);
            make_uniq<duckdb::SetOperationNode,duckdb::SetOperationType&,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,true>,bool&>
                      ((duckdb *)&local_88,&setop_type_local,pvVar4,args_2,
                       (vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                        *)&empty_children.
                           super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                       ,&setop_all_local);
            local_80._M_head_impl = local_88;
            local_88 = (QueryNode *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
                        *)&new_children,
                       (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                        *)&local_80);
            if (local_80._M_head_impl != (QueryNode *)0x0) {
              (*(local_80._M_head_impl)->_vptr_QueryNode[1])();
            }
            if (local_88 != (QueryNode *)0x0) {
              (*local_88->_vptr_QueryNode[1])();
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
            ::~vector(&empty_children.
                       super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     );
          }
          puVar6 = (children->
                   super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (children->
                   super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ::_M_move_assign(&children->
                          super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                        );
        ::std::
        vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   *)&new_children);
        puVar6 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      p_Var1 = (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
               ::get<true>(children,0);
      ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
                ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
                 local_90,p_Var1);
      p_Var1 = (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
               vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
               ::get<true>(children,1);
      ::std::__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>::operator=
                ((__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
                 local_98,p_Var1);
      return;
    }
    pSVar5 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_children,
               "Multiple children in set-operations are only supported for UNION",
               (allocator *)&empty_children);
    SerializationException::SerializationException(pSVar5,(string *)&new_children);
    __cxa_throw(pSVar5,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar5 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&new_children,"Set Operation requires at least 2 children",
             (allocator *)&empty_children);
  SerializationException::SerializationException(pSVar5,(string *)&new_children);
  __cxa_throw(pSVar5,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SetOperationNode::SetOperationNode(SetOperationType setop_type, unique_ptr<QueryNode> left, unique_ptr<QueryNode> right,
                                   vector<unique_ptr<QueryNode>> children, bool setop_all)
    : QueryNode(QueryNodeType::SET_OPERATION_NODE), setop_type(setop_type), setop_all(setop_all) {
	if (left && right) {
		// simple case - left/right are supplied
		this->left = std::move(left);
		this->right = std::move(right);
		return;
	}
	if (children.size() == 2) {
		this->left = std::move(children[0]);
		this->right = std::move(children[1]);
	}
	// we have multiple children - we need to construct a tree of set operation nodes
	if (children.size() <= 1) {
		throw SerializationException("Set Operation requires at least 2 children");
	}
	if (setop_type != SetOperationType::UNION) {
		throw SerializationException("Multiple children in set-operations are only supported for UNION");
	}
	// construct a balanced tree from the union
	while (children.size() > 2) {
		vector<unique_ptr<QueryNode>> new_children;
		for (idx_t i = 0; i < children.size(); i += 2) {
			if (i + 1 == children.size()) {
				new_children.push_back(std::move(children[i]));
			} else {
				vector<unique_ptr<QueryNode>> empty_children;
				auto setop_node =
				    make_uniq<SetOperationNode>(setop_type, std::move(children[i]), std::move(children[i + 1]),
				                                std::move(empty_children), setop_all);
				new_children.push_back(std::move(setop_node));
			}
		}
		children = std::move(new_children);
	}
	// two children left - fill in the left/right of this node
	this->left = std::move(children[0]);
	this->right = std::move(children[1]);
}